

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937-64.c
# Opt level: O0

uint64_t genrand64_int64(void)

{
  int iVar1;
  ulong uVar2;
  uint64_t x;
  int i;
  
  if (0x137 < mti) {
    if (mti == 0x139) {
      mt_init(0x1571);
    }
    for (x._4_4_ = 0; x._4_4_ < 0x9c; x._4_4_ = x._4_4_ + 1) {
      uVar2 = mt[x._4_4_] & 0xffffffff80000000 | mt[x._4_4_ + 1] & 0x7fffffff;
      mt[x._4_4_] = mt[x._4_4_ + 0x9c] ^ uVar2 >> 1 ^ genrand64_int64::mag01[(int)((uint)uVar2 & 1)]
      ;
    }
    for (; x._4_4_ < 0x137; x._4_4_ = x._4_4_ + 1) {
      uVar2 = mt[x._4_4_] & 0xffffffff80000000 | mt[x._4_4_ + 1] & 0x7fffffff;
      mt[x._4_4_] = mt[x._4_4_ + -0x9c] ^ uVar2 >> 1 ^
                    genrand64_int64::mag01[(int)((uint)uVar2 & 1)];
    }
    uVar2 = mt[0x137] & 0xffffffff80000000 | mt[0] & 0x7fffffff;
    mt[0x137] = mt[0x9b] ^ uVar2 >> 1 ^ genrand64_int64::mag01[(int)((uint)uVar2 & 1)];
    mti = 0;
  }
  iVar1 = mti;
  mti = mti + 1;
  uVar2 = mt[iVar1] >> 0x1d & 0x5555555555555555 ^ mt[iVar1];
  uVar2 = (uVar2 & 0x38eb3ffff6d3) << 0x11 ^ uVar2;
  uVar2 = (uVar2 & 0x7ffbf77) << 0x25 ^ uVar2;
  return uVar2 >> 0x2b ^ uVar2;
}

Assistant:

static uint64_t genrand64_int64()
{
    int i;
    uint64_t x;
    static uint64_t mag01[2]={UINT64_C(0), MATRIX_A};

    if (mti >= NN) { /* generate NN words at one time */

        /* if mt_init() has not been called, */
        /* a default initial seed is used     */
        if (mti == NN+1) 
            mt_init(UINT64_C(5489)); 

        for (i=0;i<NN-MM;i++) {
            x = (mt[i]&UM)|(mt[i+1]&LM);
            mt[i] = mt[i+MM] ^ (x>>1) ^ mag01[(int)(x&UINT64_C(1))];
        }
        for (;i<NN-1;i++) {
            x = (mt[i]&UM)|(mt[i+1]&LM);
            mt[i] = mt[i+(MM-NN)] ^ (x>>1) ^ mag01[(int)(x&UINT64_C(1))];
        }
        x = (mt[NN-1]&UM)|(mt[0]&LM);
        mt[NN-1] = mt[MM-1] ^ (x>>1) ^ mag01[(int)(x&UINT64_C(1))];

        mti = 0;
    }
  
    x = mt[mti++];

    x ^= (x >> 29) & UINT64_C(0x5555555555555555);
    x ^= (x << 17) & UINT64_C(0x71D67FFFEDA60000);
    x ^= (x << 37) & UINT64_C(0xFFF7EEE000000000);
    x ^= (x >> 43);

    return x;
}